

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitUnary(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,UnaryExpr e)

{
  char *__s;
  size_t sVar1;
  BasicWriter<char> *pBVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> e_00;
  BasicStringRef<char> value;
  UnaryExpr e_local;
  
  pBVar2 = this->writer_;
  e_local = e;
  __s = mp::expr::str(*(Kind *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                               super_ExprBase.impl_);
  sVar1 = strlen(__s);
  value.size_ = sVar1;
  value.data_ = __s;
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,value);
  fmt::BasicWriter<char>::operator<<(pBVar2,'(');
  e_00 = BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
         ::arg(&e_local);
  Visit(this,(NumericExpr)e_00.super_ExprBase.impl_,0);
  fmt::BasicWriter<char>::operator<<(this->writer_,')');
  return;
}

Assistant:

void VisitUnary(UnaryExpr e) {
    writer_ << str(e.kind()) << '(';
    Visit(e.arg(), prec::UNKNOWN);
    writer_ << ')';
  }